

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O1

char __thiscall helics::Input::getValueChar(Input *this)

{
  DataType baseType;
  char cVar1;
  bool bVar2;
  double dVar3;
  char V;
  data_view dv;
  string local_58;
  data_view local_38;
  
  checkAndGetFedUpdate(&local_38,this);
  if (local_38.dblock._M_len == 0) goto LAB_00249774;
  if (this->injectionType == HELICS_UNKNOWN) {
    loadSourceInformation(this);
  }
  baseType = this->injectionType;
  if (((0x19 < (uint)baseType) ||
      ((0x2000201U >> (baseType & (HELICS_JSON|HELICS_DOUBLE)) & 1) == 0)) &&
     (baseType != HELICS_ANY)) {
    local_58._M_dataplus._M_p = (pointer)0x8000000000000000;
    if (baseType == HELICS_DOUBLE) {
      dVar3 = doubleExtractAndConvert(&local_38,&this->inputUnits,&this->outputUnits);
      local_58._M_dataplus._M_p = (pointer)(long)dVar3;
    }
    else {
      valueExtract<long>(&local_38,baseType,(long *)&local_58);
    }
    if (this->changeDetectionEnabled == true) {
      bVar2 = changeDetected(&this->lastValue,(int64_t)local_58._M_dataplus._M_p,this->delta);
      if (!bVar2) goto LAB_00249774;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,(long *)&local_58);
    goto LAB_00249774;
  }
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  helics::valueExtract(&local_38,baseType,&local_58);
  if (this->changeDetectionEnabled == true) {
    bVar2 = changeDetected(&this->lastValue,&local_58,this->delta);
    if (bVar2) goto LAB_002496e1;
  }
  else {
LAB_002496e1:
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)&this->lastValue,&local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
LAB_00249774:
  helics::valueExtract(&this->lastValue,(char *)&local_58);
  this->hasUpdate = false;
  cVar1 = (char)local_58._M_dataplus._M_p;
  if (local_38.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.ref.
               super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return cVar1;
}

Assistant:

char Input::getValueChar()
{
    auto dv = checkAndGetFedUpdate();
    if (!dv.empty()) {
        if (injectionType == DataType::HELICS_UNKNOWN) {
            loadSourceInformation();
        }

        if ((injectionType == DataType::HELICS_STRING) || (injectionType == DataType::HELICS_ANY) ||
            (injectionType == DataType::HELICS_CHAR) ||
            (injectionType == DataType::HELICS_CUSTOM)) {
            std::string out;
            valueExtract(dv, injectionType, out);
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        } else {
            int64_t out = invalidValue<int64_t>();
            if (injectionType == helics::DataType::HELICS_DOUBLE) {
                out = static_cast<int64_t>(doubleExtractAndConvert(dv, inputUnits, outputUnits));
            } else {
                valueExtract(dv, injectionType, out);
            }
            if (changeDetectionEnabled) {
                if (changeDetected(lastValue, out, delta)) {
                    lastValue = out;
                }
            } else {
                lastValue = out;
            }
        }
    }
    char V;
    valueExtract(lastValue, V);
    hasUpdate = false;
    return V;
}